

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O3

optional<DevFmtChannels> __thiscall
anon_unknown.dwarf_85896::DevFmtChannelsFromEnum(anon_unknown_dwarf_85896 *this,ALCenum channels)

{
  optional<DevFmtChannels> oVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(channels - 0x1500U);
  uVar4 = uVar3;
  if (channels - 0x1500U < 8) {
    uVar4 = (long)&switchD_00132b50::switchdataD_00174234 +
            (long)(int)(&switchD_00132b50::switchdataD_00174234)[uVar3];
    oVar1 = SUB82(uVar4,0);
    switch(uVar3) {
    case 0:
      *(undefined2 *)this = 1;
      break;
    case 1:
      *(undefined2 *)this = 0x101;
      break;
    case 2:
      goto switchD_00132b50_caseD_2;
    case 3:
      *(undefined2 *)this = 0x201;
      break;
    case 4:
      *(undefined2 *)this = 0x301;
      break;
    case 5:
      *(undefined2 *)this = 0x401;
      break;
    case 6:
      *(undefined2 *)this = 0x501;
      break;
    case 7:
      *(undefined2 *)this = 0x601;
    }
  }
  else {
switchD_00132b50_caseD_2:
    oVar1 = SUB82(uVar4,0);
    if (1 < (int)gLogLevel) {
      iVar2 = fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Unsupported format channels: 0x%04x\n");
      oVar1 = SUB42(iVar2,0);
    }
    *(undefined2 *)this = 0;
  }
  return oVar1;
}

Assistant:

al::optional<DevFmtChannels> DevFmtChannelsFromEnum(ALCenum channels)
{
    switch(channels)
    {
    case ALC_MONO_SOFT: return al::make_optional(DevFmtMono);
    case ALC_STEREO_SOFT: return al::make_optional(DevFmtStereo);
    case ALC_QUAD_SOFT: return al::make_optional(DevFmtQuad);
    case ALC_5POINT1_SOFT: return al::make_optional(DevFmtX51);
    case ALC_6POINT1_SOFT: return al::make_optional(DevFmtX61);
    case ALC_7POINT1_SOFT: return al::make_optional(DevFmtX71);
    case ALC_BFORMAT3D_SOFT: return al::make_optional(DevFmtAmbi3D);
    }
    WARN("Unsupported format channels: 0x%04x\n", channels);
    return al::nullopt;
}